

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

bool __thiscall
perfetto::protos::gen::GpuCounterConfig::ParseFromArray
          (GpuCounterConfig *this,void *raw,size_t size)

{
  byte bVar1;
  pointer puVar2;
  uint uVar3;
  undefined1 uVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  uint *puVar9;
  bool bVar10;
  uint *puVar11;
  ulong uVar12;
  uint *puVar13;
  uint *puVar14;
  uint uVar15;
  uint *puVar16;
  uint *puVar17;
  uint *puVar18;
  bool bVar19;
  uint *local_70;
  Field local_68;
  uint *local_58;
  uint *local_50;
  GpuCounterConfig *local_48;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  
  puVar2 = (this->counter_ids_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->counter_ids_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (this->counter_ids_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  local_40 = &this->counter_ids_;
  local_38 = &this->unknown_fields_;
  (this->unknown_fields_)._M_string_length = 0;
  *(this->unknown_fields_)._M_dataplus._M_p = '\0';
  puVar18 = (uint *)(size + (long)raw);
  do {
    lVar8 = 7;
    if (puVar18 <= raw) goto LAB_0023a922;
    uVar12 = (ulong)(char)(byte)*raw;
    puVar17 = (uint *)((long)raw + 1);
    if ((long)uVar12 < 0) {
      bVar1 = (byte)*raw;
      uVar6 = (ulong)(bVar1 & 0x7f);
      bVar10 = false;
      puVar9 = puVar17;
      for (lVar7 = lVar8;
          (puVar13 = puVar9, uVar12 = uVar6, (char)bVar1 < '\0' &&
          (bVar19 = 0x38 < lVar7 - 7U, bVar10 = bVar19 || puVar18 <= puVar9, size = (size_t)puVar9,
          puVar13 = puVar17, uVar12 = 0, !bVar19 && puVar18 > puVar9)); lVar7 = lVar7 + 7) {
        bVar1 = (byte)*puVar9;
        puVar9 = (uint *)((long)puVar9 + 1);
        uVar6 = uVar6 | (ulong)(bVar1 & 0x7f) << ((byte)lVar7 & 0x3f);
        size = (size_t)puVar9;
      }
      puVar17 = puVar13;
      if (bVar10) {
        puVar17 = (uint *)raw;
        uVar12 = 0;
      }
      if (puVar17 == (uint *)raw) goto LAB_0023a922;
    }
    uVar5 = (uint)(uVar12 >> 3);
    if ((uVar5 == 0) || (puVar18 <= puVar17)) {
switchD_0023a799_caseD_3:
      bVar10 = false;
      uVar12 = 0;
      local_68.int_value_ = (uint64_t)(uint *)0x0;
    }
    else {
      switch((uint)uVar12 & 7) {
      case 0:
        puVar11 = (uint *)0x0;
        bVar10 = puVar17 >= puVar18;
        if (puVar17 < puVar18) {
          size = (long)puVar17 + 1;
          puVar9 = (uint *)(ulong)((byte)*puVar17 & 0x7f);
          puVar13 = puVar9;
          uVar15 = 0;
          if ((char)(byte)*puVar17 < '\0') {
            puVar13 = (uint *)0x0;
            uVar15 = 0;
            lVar8 = 7;
            puVar16 = (uint *)size;
            do {
              bVar19 = 0x38 < lVar8 - 7U;
              bVar10 = bVar19 || puVar18 <= puVar16;
              if (bVar19 || puVar18 <= puVar16) goto LAB_0023a929;
              uVar3 = *puVar16;
              puVar16 = (uint *)((long)puVar16 + 1);
              puVar9 = (uint *)((ulong)puVar9 | (ulong)((byte)uVar3 & 0x7f) << ((byte)lVar8 & 0x3f))
              ;
              lVar8 = lVar8 + 7;
            } while ((char)(byte)uVar3 < '\0');
            puVar13 = (uint *)((ulong)puVar9 & 0xffffffff);
            size = (size_t)puVar16;
            uVar15 = (uint)((ulong)puVar9 >> 0x20);
          }
        }
        else {
          puVar13 = (uint *)0x0;
          uVar15 = 0;
        }
LAB_0023a929:
        puVar9 = (uint *)(ulong)uVar15;
        if (bVar10) {
          size = (size_t)puVar17;
          puVar9 = puVar11;
          puVar13 = puVar11;
        }
        local_70 = puVar17;
        local_50 = (uint *)raw;
        if ((uint *)size != puVar17) goto LAB_0023a950;
        uVar12 = 0;
        bVar10 = false;
        local_68.int_value_ = (uint64_t)puVar11;
        goto LAB_0023a992;
      case 1:
        size = (size_t)(puVar17 + 2);
        if (puVar18 < size) {
LAB_0023a922:
          uVar12 = 0;
          bVar10 = false;
          local_68.int_value_ = (uint64_t)(uint *)0x0;
          goto LAB_0023a992;
        }
        puVar13 = *(uint **)puVar17;
        puVar9 = (uint *)((ulong)puVar13 >> 0x20);
        break;
      case 2:
        bVar10 = puVar17 >= puVar18;
        puVar9 = local_58;
        if (puVar17 < puVar18) {
          bVar1 = (byte)*puVar17;
          puVar11 = (uint *)(ulong)(bVar1 & 0x7f);
          puVar13 = (uint *)((long)puVar17 + 1U);
          for (; (size = (size_t)puVar13, puVar9 = puVar11, (char)bVar1 < '\0' &&
                 (bVar19 = 0x38 < lVar8 - 7U, bVar10 = bVar19 || puVar18 <= puVar13,
                 size = (size_t)((long)puVar17 + 1U), puVar9 = local_58,
                 !bVar19 && puVar18 > puVar13)); lVar8 = lVar8 + 7) {
            bVar1 = (byte)*puVar13;
            puVar13 = (uint *)((long)puVar13 + 1);
            puVar11 = (uint *)((ulong)puVar11 | (ulong)(bVar1 & 0x7f) << ((byte)lVar8 & 0x3f));
          }
        }
        local_58 = puVar9;
        if (bVar10) {
          size = (size_t)puVar17;
          local_58 = (uint *)0x0;
        }
        if (((uint *)size == puVar17) || ((uint *)((long)puVar18 - size) < local_58)) {
          puVar9 = (uint *)0x0;
          puVar13 = (uint *)0x0;
          bVar10 = false;
          puVar11 = (uint *)0x0;
        }
        else {
          puVar9 = (uint *)(size >> 0x20);
          puVar13 = (uint *)(size & 0xffffffff);
          size = size + (long)local_58;
          bVar10 = true;
          puVar11 = local_58;
        }
        local_70 = puVar17;
        if (!bVar10) goto LAB_0023a922;
        goto LAB_0023a950;
      default:
        goto switchD_0023a799_caseD_3;
      case 5:
        size = (size_t)(puVar17 + 1);
        puVar9 = (uint *)0x0;
        if (puVar18 < size) goto LAB_0023a922;
        puVar13 = (uint *)(ulong)*puVar17;
      }
      puVar11 = (uint *)0x0;
LAB_0023a950:
      bVar10 = true;
      raw = (void *)size;
      if ((uVar5 < 0x10000) && (puVar11 < (uint *)0x10000000)) {
        local_68.int_value_ = (ulong)puVar13 & 0xffffffff | (long)puVar9 << 0x20;
        uVar12 = (ulong)puVar11 | (uVar12 >> 3) << 0x20 | (ulong)((uint)uVar12 & 7) << 0x30;
        bVar10 = false;
      }
      else {
        local_68.int_value_ = 0;
        uVar12 = 0;
      }
    }
LAB_0023a992:
    puVar17 = &switchD_0023a799::switchdataD_0034d880;
    if (!bVar10) {
      local_68.size_ = (uint32_t)uVar12;
      local_68.type_ = (uint8_t)(uVar12 >> 0x30);
      local_68.id_ = (uint16_t)(uVar12 >> 0x20);
      local_48 = this;
      do {
        if (local_68.id_ == 0) {
          return puVar18 == (uint *)raw;
        }
        if ((ushort)(uVar12 >> 0x20) < 5) {
          (this->_has_field_).super__Base_bitset<1UL>._M_w =
               (this->_has_field_).super__Base_bitset<1UL>._M_w |
               1L << ((byte)(uVar12 >> 0x20) & 0x3f);
        }
        uVar5 = ((uint)(uVar12 >> 0x20) & 0xffff) - 1;
        if (uVar5 < 4) {
          uVar4 = (*(code *)(&DAT_0034d898 + *(int *)(&DAT_0034d898 + (ulong)uVar5 * 4)))();
          return (bool)uVar4;
        }
        protozero::Field::SerializeAndAppendToInternal<std::__cxx11::string>(&local_68,local_38);
        do {
          if (puVar18 <= raw) goto LAB_0023ab89;
          uVar12 = (ulong)(char)(byte)*raw;
          puVar9 = (uint *)((long)raw + 1);
          if ((long)uVar12 < 0) {
            uVar6 = (ulong)((byte)*raw & 0x7f);
            bVar10 = false;
            uVar12 = uVar6;
            puVar13 = puVar9;
            if ((char)(byte)*raw < '\0') {
              lVar8 = 7;
              puVar11 = puVar9;
              do {
                bVar10 = 0x38 < lVar8 - 7U || puVar18 <= puVar11;
                uVar12 = 0;
                puVar13 = puVar9;
                if (bVar10) break;
                uVar5 = *puVar11;
                puVar13 = (uint *)((long)puVar11 + 1);
                uVar6 = uVar6 | (ulong)((byte)uVar5 & 0x7f) << ((byte)lVar8 & 0x3f);
                lVar8 = lVar8 + 7;
                uVar12 = uVar6;
                puVar11 = puVar13;
              } while ((char)(byte)uVar5 < '\0');
            }
            puVar9 = puVar13;
            if (bVar10) {
              puVar9 = (uint *)raw;
              uVar12 = 0;
            }
            if (puVar9 == (uint *)raw) goto LAB_0023ab89;
          }
          uVar5 = (uint)(uVar12 >> 3);
          if ((uVar5 == 0) || (puVar18 <= puVar9)) {
switchD_0023ac28_caseD_3:
            local_68.int_value_ = 0;
            bVar10 = false;
            uVar12 = 0;
            goto LAB_0023ae62;
          }
          switch((uint)uVar12 & 7) {
          case 0:
            local_68.int_value_ = 0;
            bVar10 = puVar9 >= puVar18;
            if (puVar9 < puVar18) {
              puVar13 = (uint *)((long)puVar9 + 1);
              uVar15 = (byte)*puVar9 & 0x7f;
              uVar6 = (ulong)uVar15;
              puVar11 = (uint *)(ulong)uVar15;
              puVar17 = puVar13;
              uVar15 = 0;
              if ((char)(byte)*puVar9 < '\0') {
                puVar11 = (uint *)0x0;
                lVar8 = 7;
                puVar16 = puVar13;
                do {
                  bVar19 = 0x38 < lVar8 - 7U;
                  bVar10 = bVar19 || puVar18 <= puVar16;
                  puVar17 = puVar13;
                  uVar15 = 0;
                  if (bVar19 || puVar18 <= puVar16) break;
                  bVar1 = (byte)*puVar16;
                  puVar16 = (uint *)((long)puVar16 + 1);
                  uVar6 = uVar6 | (ulong)(bVar1 & 0x7f) << ((byte)lVar8 & 0x3f);
                  lVar8 = lVar8 + 7;
                  if (-1 < (char)bVar1) {
                    puVar11 = (uint *)(uVar6 & 0xffffffff);
                  }
                  puVar17 = puVar16;
                  uVar15 = (uint)(uVar6 >> 0x20);
                } while (-1 >= (char)bVar1);
              }
            }
            else {
              puVar11 = (uint *)0x0;
              uVar15 = 0;
            }
            if (bVar10) {
              puVar11 = (uint *)local_68.int_value_;
            }
            puVar13 = (uint *)(ulong)uVar15;
            if (bVar10) {
              puVar17 = puVar9;
              puVar13 = (uint *)local_68.int_value_;
            }
            this = local_48;
            puVar16 = (uint *)local_68.int_value_;
            local_58 = puVar9;
            local_50 = (uint *)raw;
            if (puVar17 == puVar9) {
              uVar12 = 0;
              bVar10 = false;
            }
            else {
LAB_0023ae21:
              raw = puVar17;
              bVar10 = true;
              puVar17 = (uint *)raw;
              if ((uVar5 < 0x10000) && (puVar16 < (uint *)0x10000000)) {
                local_68.int_value_ = (ulong)puVar11 & 0xffffffff | (long)puVar13 << 0x20;
                uVar12 = (ulong)puVar16 | (uVar12 >> 3) << 0x20 | (uVar12 & 7) << 0x30;
                bVar10 = false;
              }
              else {
                local_68.int_value_ = 0;
                uVar12 = 0;
              }
            }
            break;
          case 1:
            puVar17 = puVar9 + 2;
            if (puVar17 <= puVar18) {
              puVar11 = *(uint **)puVar9;
              puVar13 = (uint *)((ulong)puVar11 >> 0x20);
LAB_0023ac90:
              puVar16 = (uint *)0x0;
              goto LAB_0023ae21;
            }
            goto LAB_0023ab89;
          case 2:
            bVar10 = puVar9 >= puVar18;
            puVar13 = local_70;
            if (puVar9 < puVar18) {
              puVar11 = (uint *)((long)puVar9 + 1);
              puVar16 = (uint *)(ulong)((byte)*puVar9 & 0x7f);
              puVar17 = puVar11;
              puVar13 = puVar16;
              if ((char)(byte)*puVar9 < '\0') {
                lVar8 = 7;
                puVar14 = puVar11;
                do {
                  bVar10 = 0x38 < lVar8 - 7U || puVar18 <= puVar14;
                  puVar17 = puVar11;
                  puVar13 = local_70;
                  if (bVar10) break;
                  uVar15 = *puVar14;
                  puVar14 = (uint *)((long)puVar14 + 1);
                  puVar16 = (uint *)((ulong)puVar16 |
                                    (ulong)((byte)uVar15 & 0x7f) << ((byte)lVar8 & 0x3f));
                  lVar8 = lVar8 + 7;
                  puVar17 = puVar14;
                  puVar13 = puVar16;
                } while ((char)(byte)uVar15 < '\0');
              }
            }
            local_70 = puVar13;
            puVar11 = (uint *)0x0;
            if (bVar10) {
              puVar17 = puVar9;
              local_70 = puVar11;
            }
            if (puVar17 == puVar9) {
              puVar13 = (uint *)0x0;
              bVar10 = false;
              puVar16 = (uint *)0x0;
            }
            else if ((uint *)((long)puVar18 - (long)puVar17) < local_70) {
              puVar11 = (uint *)0x0;
              puVar13 = (uint *)0x0;
              bVar10 = false;
              puVar16 = (uint *)0x0;
            }
            else {
              puVar13 = (uint *)((ulong)puVar17 >> 0x20);
              puVar11 = (uint *)((ulong)puVar17 & 0xffffffff);
              puVar17 = (uint *)((long)puVar17 + (long)local_70);
              bVar10 = true;
              puVar16 = local_70;
            }
            if (bVar10) goto LAB_0023ae21;
            local_68.int_value_ = 0;
            uVar12 = 0;
            bVar10 = false;
            break;
          default:
            goto switchD_0023ac28_caseD_3;
          case 5:
            puVar17 = puVar9 + 1;
            puVar13 = (uint *)0x0;
            if (puVar17 <= puVar18) {
              puVar11 = (uint *)(ulong)*puVar9;
              goto LAB_0023ac90;
            }
LAB_0023ab89:
            local_68.int_value_ = 0;
            uVar12 = 0;
            bVar10 = false;
          }
LAB_0023ae62:
        } while (bVar10);
        local_68.size_ = (uint32_t)uVar12;
        local_68.type_ = (uint8_t)(uVar12 >> 0x30);
        local_68.id_ = (uint16_t)(uVar12 >> 0x20);
      } while( true );
    }
  } while( true );
}

Assistant:

bool GpuCounterConfig::ParseFromArray(const void* raw, size_t size) {
  counter_ids_.clear();
  unknown_fields_.clear();
  bool packed_error = false;

  ::protozero::ProtoDecoder dec(raw, size);
  for (auto field = dec.ReadField(); field.valid(); field = dec.ReadField()) {
    if (field.id() < _has_field_.size()) {
      _has_field_.set(field.id());
    }
    switch (field.id()) {
      case 1 /* counter_period_ns */:
        field.get(&counter_period_ns_);
        break;
      case 2 /* counter_ids */:
        counter_ids_.emplace_back();
        field.get(&counter_ids_.back());
        break;
      case 3 /* instrumented_sampling */:
        field.get(&instrumented_sampling_);
        break;
      case 4 /* fix_gpu_clock */:
        field.get(&fix_gpu_clock_);
        break;
      default:
        field.SerializeAndAppendTo(&unknown_fields_);
        break;
    }
  }
  return !packed_error && !dec.bytes_left();
}